

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeString(ParserImpl *this,string *text)

{
  bool bVar1;
  ParserImpl *in_RDI;
  Tokenizer *in_stack_00000078;
  string *in_stack_00000088;
  string *in_stack_00000090;
  undefined8 in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb8;
  ParserImpl *in_stack_ffffffffffffffc0;
  string local_38 [40];
  ParserImpl *__rhs;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  __rhs = in_RDI;
  bVar1 = LookingAtType(in_RDI,(TokenType)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if (bVar1) {
    std::__cxx11::string::clear();
    while( true ) {
      bVar1 = LookingAtType(in_RDI,(TokenType)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      if (!bVar1) break;
      io::Tokenizer::current(&in_RDI->tokenizer_);
      io::Tokenizer::ParseStringAppend(in_stack_00000090,in_stack_00000088);
      io::Tokenizer::Next(in_stack_00000078);
    }
    bVar1 = true;
  }
  else {
    io::Tokenizer::current(&in_RDI->tokenizer_);
    std::operator+((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    ReportError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_38);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConsumeString(std::string* text) {
    if (!LookingAtType(io::Tokenizer::TYPE_STRING)) {
      ReportError("Expected string, got: " + tokenizer_.current().text);
      return false;
    }

    text->clear();
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(tokenizer_.current().text, text);

      tokenizer_.Next();
    }

    return true;
  }